

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall cmSourceFileLocation::Update(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  if (((this->AmbiguousDirectory & 1U) != 0) && ((loc->AmbiguousDirectory & 1U) == 0)) {
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&loc->Directory);
    this->AmbiguousDirectory = false;
  }
  if (((this->AmbiguousExtension & 1U) != 0) && ((loc->AmbiguousExtension & 1U) == 0)) {
    std::__cxx11::string::operator=((string *)&this->Name,(string *)&loc->Name);
    this->AmbiguousExtension = false;
  }
  return;
}

Assistant:

void cmSourceFileLocation::Update(cmSourceFileLocation const& loc)
{
  if(this->AmbiguousDirectory && !loc.AmbiguousDirectory)
    {
    this->Directory = loc.Directory;
    this->AmbiguousDirectory = false;
    }
  if(this->AmbiguousExtension && !loc.AmbiguousExtension)
    {
    this->Name = loc.Name;
    this->AmbiguousExtension = false;
    }
}